

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCalibrationHelper.cpp
# Opt level: O2

bool __thiscall
iDynTree::ModelCalibrationHelper::updateModelInertialParametersToString
          (ModelCalibrationHelper *this,string *model_string,VectorDynSize *inertialParams,
          string *filetype,ModelExporterOptions *options)

{
  _Head_base<0UL,_iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl_*,_false> _Var1;
  char cVar2;
  bool bVar3;
  int iVar4;
  Model *pMVar5;
  bool bVar6;
  char *pcVar7;
  Model exportedModel;
  string local_1e0;
  ModelExporterOptions local_1c0;
  Model local_160 [304];
  
  pMVar5 = model(this);
  iDynTree::Model::Model(local_160,pMVar5);
  cVar2 = iDynTree::Model::updateInertialParameters((VectorDynSize *)local_160);
  if (cVar2 == '\0') {
    pcVar7 = "Error in iDynTree::Model::updateInertialParameters method.";
  }
  else {
    _Var1._M_head_impl =
         (this->m_pimpl)._M_t.
         super___uniq_ptr_impl<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl,_std::default_delete<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl_*,_std::default_delete<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl>_>
         .
         super__Head_base<0UL,_iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl_*,_false>
         ._M_head_impl;
    ModelExporterOptions::ModelExporterOptions(&local_1c0,options);
    iVar4 = ModelExporter::init(&(_Var1._M_head_impl)->modelExporter,(EVP_PKEY_CTX *)local_160);
    ModelExporterOptions::~ModelExporterOptions(&local_1c0);
    pcVar7 = "Error in ModelExporter::exportModelToString method.";
    if ((char)iVar4 != '\0') {
      _Var1._M_head_impl =
           (this->m_pimpl)._M_t.
           super___uniq_ptr_impl<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl,_std::default_delete<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl_*,_std::default_delete<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl>_>
           .
           super__Head_base<0UL,_iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl_*,_false>
           ._M_head_impl;
      std::__cxx11::string::string((string *)&local_1e0,(string *)filetype);
      bVar3 = ModelExporter::exportModelToString
                        (&(_Var1._M_head_impl)->modelExporter,model_string,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      bVar6 = true;
      if (bVar3) goto LAB_00134636;
    }
  }
  iDynTree::reportError("ModelCalibrationHelper","updateModelInertialParametersToString",pcVar7);
  bVar6 = false;
LAB_00134636:
  iDynTree::Model::~Model(local_160);
  return bVar6;
}

Assistant:

bool ModelCalibrationHelper::updateModelInertialParametersToString(std::string & model_string, 
                                                                       const iDynTree::VectorDynSize& inertialParams,
                                                                       const std::string filetype,
                                                                       const ModelExporterOptions options)
    {
        Model exportedModel = this->model();
        
        bool ok = exportedModel.updateInertialParameters(inertialParams);
        if (!ok) {
            reportError("ModelCalibrationHelper", "updateModelInertialParametersToString", "Error in iDynTree::Model::updateInertialParameters method.");
            return false;
        }
        
        ok = m_pimpl->modelExporter.init(exportedModel, options);
        ok = ok && m_pimpl->modelExporter.exportModelToString(model_string, filetype);
        if (!ok) {
            reportError("ModelCalibrationHelper", "updateModelInertialParametersToString", "Error in ModelExporter::exportModelToString method.");
            return false;
        }

        return true;
    }